

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

QStringList * QProcess::systemEnvironment(void)

{
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QProcessEnvironment local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QProcessEnvironment::systemEnvironment();
  if (local_20.d.d.ptr == (totally_ordered_wrapper<QProcessEnvironmentPrivate_*>)0x0) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (QString *)0x0;
    (in_RDI->d).size = 0;
  }
  else {
    QProcessEnvironmentPrivate::toList(in_RDI,(QProcessEnvironmentPrivate *)local_20.d.d.ptr);
  }
  QProcessEnvironment::~QProcessEnvironment(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QProcess::systemEnvironment()
{
    return QProcessEnvironment::systemEnvironment().toStringList();
}